

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::getDataSize(DrawIndirectBase *this,int *width,int *height)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  iVar2 = 0x4000;
  if (*(int *)CONCAT44(extraout_var,iVar1) < 0x4000) {
    iVar2 = *(int *)CONCAT44(extraout_var,iVar1);
  }
  *width = iVar2;
  iVar2 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 4);
  iVar1 = (int)(0x10000 / (long)*width);
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  *height = iVar2;
  return;
}

Assistant:

void getDataSize(int& width, int& height)
	{
		width  = std::min(getWindowWidth(), 16384);				 // Cap width to 16384
		height = std::min(getWindowHeight(), 4 * 16384 / width); // Height is 4 if width is capped
	}